

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall
CTPNStmObjectBase::CTPNStmObjectBase(CTPNStmObjectBase *this,CTcSymObj *obj_sym,int is_class)

{
  byte in_DL;
  CTPNSuperclass *in_RSI;
  CTPNObjDef *in_RDI;
  
  CTPNStmTop::CTPNStmTop((CTPNStmTop *)in_RDI);
  CTPNObjDef::CTPNObjDef(in_RDI);
  in_RDI->_vptr_CTPNObjDef = (_func_int **)&PTR___cxa_pure_virtual_003d5b18;
  (in_RDI->sclist_).head_ = (CTPNSuperclass *)&DAT_003d5c48;
  (in_RDI->sclist_).tail_ = in_RSI;
  *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) =
       *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) & 0xfd;
  *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) =
       *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) & 0xfb;
  *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) =
       *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) & 0xfe | in_DL & 1;
  *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) =
       *(byte *)((long)&in_RDI[1].proplist_.dst_ + 1) & 0xf7;
  return;
}

Assistant:

CTPNStmObjectBase(class CTcSymObj *obj_sym, int is_class)
    {
        /* remember our defining global symbol */
        obj_sym_ = obj_sym;

        /* we're not yet replaced by another object */
        replaced_ = FALSE;

        /* we're not yet modified */
        modified_ = FALSE;

        /* note whether I'm a class or an ordinary object instance */
        is_class_ = is_class;

        /* presume it's not transient */
        transient_ = FALSE;
    }